

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O1

void __thiscall gl4cts::TextureBarrierBasicOutline::deinit(TextureBarrierBasicOutline *this)

{
  int iVar1;
  undefined4 extraout_var;
  GLuint i;
  long lVar3;
  long lVar2;
  
  iVar1 = (*((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 8))(0x84c0);
  (**(code **)(lVar2 + 0x480))(8,this->m_tex);
  lVar3 = 0;
  do {
    if (this->m_reference[lVar3] != (GLuint *)0x0) {
      operator_delete__(this->m_reference[lVar3]);
      this->m_reference[lVar3] = (GLuint *)0x0;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  if (this->m_actual != (GLuint *)0x0) {
    operator_delete__(this->m_actual);
    this->m_actual = (GLuint *)0x0;
  }
  (**(code **)(lVar2 + 0x78))(0x8d40,0);
  (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0xd8))(0);
  (**(code **)(lVar2 + 0x438))(1,&this->m_vbo);
  (**(code **)(lVar2 + 0x490))(1,&this->m_vao);
  (**(code **)(lVar2 + 0xff0))(0xd05,4);
  (**(code **)(lVar2 + 0xff0))(0xcf5,4);
  return;
}

Assistant:

virtual void deinit()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// Cleanup textures
		gl.activeTexture(GL_TEXTURE0);
		gl.deleteTextures(NUM_TEXTURES, m_tex);
		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			if (DE_NULL != m_reference[i])
			{
				delete[] m_reference[i];
				m_reference[i] = DE_NULL;
			}
		}

		if (DE_NULL != m_actual)
		{
			delete[] m_actual;
			m_actual = DE_NULL;
		}

		// Cleanup framebuffer
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		gl.deleteFramebuffers(1, &m_fbo);

		// Cleanup vertex array and buffer
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteBuffers(1, &m_vbo);
		gl.deleteVertexArrays(1, &m_vao);

		// Cleanup state
		gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
		gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);
	}